

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.h
# Opt level: O0

void __thiscall DataSourceBase::~DataSourceBase(DataSourceBase *this)

{
  code *pcVar1;
  DataSourceBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~DataSourceBase() {}